

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseDecisionDag.cpp
# Opt level: O0

void __thiscall
slang::analysis::CaseDecisionDag::CaseDecisionDag
          (CaseDecisionDag *this,span<const_slang::SVInt,_18446744073709551615UL> clauses,
          uint32_t bitWidth,bool wildcardX,uint32_t maxSteps)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  span<const_slang::SVInt,_18446744073709551615UL> clauses_00;
  undefined8 uVar1;
  undefined8 uVar2;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar3;
  uint *__x;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  size_type sVar7;
  size_t sVar8;
  group_type *pgVar9;
  value_type_conflict4 *pvVar10;
  equal_to<unsigned_int> *this_00;
  uint *puVar11;
  uint *__y;
  value_type_pointer in_RDX;
  group_type_pointer in_RSI;
  long in_RDI;
  byte in_R8B;
  uint in_R9D;
  ClauseIndex index;
  size_t i;
  SVInt start;
  vector<unsigned_int,_std::allocator<unsigned_int>_> activeIndices;
  uint32_t in_stack_000002a0;
  size_t hash;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000002b0;
  uint n;
  value_type_conflict4 *p;
  value_type_conflict4 *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc;
  size_t pos0;
  size_t hash_1;
  uint *k;
  uint n_1;
  value_type_conflict4 *p_1;
  value_type_conflict4 *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  undefined4 in_stack_fffffffffffffbb8;
  uint uVar12;
  undefined4 in_stack_fffffffffffffbbc;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffbc0;
  anon_class_8_1_8991fb9c pred;
  undefined8 in_stack_fffffffffffffbc8;
  bitwidth_t bits;
  group15<boost::unordered::detail::foa::plain_integral> *this_01;
  allocator_type *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffbe0;
  undefined7 in_stack_fffffffffffffc28;
  table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_02;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_2f8;
  iterator local_2e0;
  table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_2d0;
  table_element_pointer local_2c8;
  group15<boost::unordered::detail::foa::plain_integral> local_2bc;
  undefined4 local_2ac;
  undefined1 local_2a8 [80];
  group15<boost::unordered::detail::foa::plain_integral> local_258 [2];
  uint local_22c;
  byte local_225;
  group_type_pointer local_218;
  value_type_pointer ppStack_210;
  group15<boost::unordered::detail::foa::plain_integral> *local_208;
  size_t local_200;
  table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_1f8;
  table_element_pointer local_1f0;
  group15<boost::unordered::detail::foa::plain_integral> *local_1e8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_unsigned_int>
  local_1d8;
  group15<boost::unordered::detail::foa::plain_integral> *local_1c0;
  size_t local_1b8;
  iterator local_1b0;
  size_t local_1a0;
  group15<boost::unordered::detail::foa::plain_integral> *local_198;
  size_t local_190;
  uint local_184;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  pointer in_stack_fffffffffffffe98;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffea0;
  pow2_quadratic_prober local_158;
  size_t local_148;
  size_t local_140;
  group15<boost::unordered::detail::foa::plain_integral> *local_138;
  size_t local_130;
  group15<boost::unordered::detail::foa::plain_integral> *local_128;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [25];
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_unsigned_int>
  local_a0;
  size_t local_88;
  size_t local_80;
  uint *local_78;
  group15<boost::unordered::detail::foa::plain_integral> *local_70;
  uint local_5c;
  value_type_conflict4 *local_58;
  value_type_conflict4 *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  uint *local_10;
  
  uVar5 = (undefined1)((ulong)in_stack_fffffffffffffe80 >> 0x38);
  bits = (bitwidth_t)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  local_225 = in_R8B & 1;
  local_22c = in_R9D;
  local_218 = in_RSI;
  ppStack_210 = in_RDX;
  boost::unordered::
  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_flat_set
            ((unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)in_stack_fffffffffffffbe0);
  boost::unordered::
  unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::unordered_flat_set
            ((unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)in_stack_fffffffffffffbe0);
  std::optional<slang::SVInt>::optional((optional<slang::SVInt> *)0xa8822e);
  *(undefined1 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  boost::unordered::
  unordered_flat_set<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_flat_set
            ((unordered_flat_set<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              *)in_stack_fffffffffffffbe0);
  boost::unordered::
  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_flat_set
            ((unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)in_stack_fffffffffffffbe0);
  std::span<const_slang::SVInt,_18446744073709551615UL>::size
            ((span<const_slang::SVInt,_18446744073709551615UL> *)0xa88285);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xa882a2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffbe0,
             CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),in_stack_fffffffffffffbd0
            );
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)(local_2a8 + 0x4f));
  local_2a8._64_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  local_2a8._56_8_ =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  __last._M_current._4_4_ = in_stack_fffffffffffffbbc;
  __last._M_current._0_4_ = in_stack_fffffffffffffbb8;
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
            (in_stack_fffffffffffffbc0,__last,0);
  SVInt::SVInt((SVInt *)in_stack_fffffffffffffbd0,bits,
               (uint64_t)in_stack_fffffffffffffbc0._M_current,
               SUB41((uint)in_stack_fffffffffffffbbc >> 0x18,0));
  uVar12 = local_22c;
  local_2a8._16_8_ = local_218;
  local_2a8._24_8_ = ppStack_210;
  SVInt::SVInt((SVInt *)in_stack_fffffffffffffbc0._M_current,
               (SVInt *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
  this_01 = local_258;
  pred.this = (CaseDecisionDag *)local_2a8;
  clauses_00._M_extent._M_extent_value = in_stack_fffffffffffffea0._M_extent_value;
  clauses_00._M_ptr = in_stack_fffffffffffffe98;
  build((CaseDecisionDag *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
        (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20),clauses_00,
        (uint32_t)in_stack_fffffffffffffe88,(bool)uVar5,in_stack_000002a0,(SVInt *)hash,
        in_stack_000002b0);
  SVInt::~SVInt((SVInt *)in_stack_fffffffffffffbd0);
  if (*(uint *)(in_RDI + 0x7c) < local_22c) {
    local_2bc.m[4].n = '\0';
    local_2bc.m[5].n = '\0';
    local_2bc.m[6].n = '\0';
    local_2bc.m[7].n = '\0';
    local_2bc.m[8].n = '\0';
    local_2bc.m[9].n = '\0';
    local_2bc.m[10].n = '\0';
    local_2bc.m[0xb].n = '\0';
    for (; uVar1 = local_2bc.m._4_8_,
        sVar7 = std::span<const_slang::SVInt,_18446744073709551615UL>::size
                          ((span<const_slang::SVInt,_18446744073709551615UL> *)0xa88515),
        uVar2 = local_2bc.m._4_8_, (ulong)uVar1 < sVar7; local_2bc.m._4_8_ = local_2bc.m._4_8_ + 1)
    {
      local_2bc.m[0].n = local_2bc.m[4].n;
      local_2bc.m[1].n = local_2bc.m[5].n;
      local_2bc.m[2].n = local_2bc.m[6].n;
      local_2bc.m[3].n = local_2bc.m[7].n;
      sVar8 = in_RDI + 0xb0;
      local_208 = &local_2bc;
      local_2bc.m._4_8_ = uVar2;
      local_200 = sVar8;
      local_1c0 = local_208;
      local_1b8 = sVar8;
      local_198 = local_208;
      local_190 = sVar8;
      local_1a0 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::hash_for<unsigned_int>
                            ((table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)pred.this,(uint *)CONCAT44(in_stack_fffffffffffffbbc,uVar12));
      pgVar3 = local_198;
      local_140 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)pred.this,CONCAT44(in_stack_fffffffffffffbbc,uVar12));
      local_138 = pgVar3;
      local_148 = local_1a0;
      local_130 = sVar8;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_158,local_140);
      do {
        sVar8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_158);
        pgVar9 = boost::unordered::detail::foa::
                 table_arrays<unsigned_int,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<unsigned_int>_>
                 ::groups((table_arrays<unsigned_int,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<unsigned_int>_>
                           *)0xa8868a);
        pgVar9 = pgVar9 + sVar8;
        uVar6 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          (this_01,(size_t)pred.this);
        if (uVar6 != 0) {
          pvVar10 = boost::unordered::detail::foa::
                    table_arrays<unsigned_int,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<unsigned_int>_>
                    ::elements((table_arrays<unsigned_int,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<unsigned_int>_>
                                *)0xa886e8);
          pvVar10 = pvVar10 + sVar8 * 0xf;
          do {
            local_184 = boost::unordered::detail::foa::unchecked_countr_zero(0);
            this_00 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::pred((table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)0xa8873b);
            pgVar3 = local_138;
            puVar11 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::key_from<unsigned_int>((uint *)0xa8876b);
            bVar4 = std::equal_to<unsigned_int>::operator()(this_00,(uint *)pgVar3,puVar11);
            if (bVar4) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_unsigned_int>
              ::table_locator(&local_1d8,pgVar9,local_184,pvVar10 + local_184);
              goto LAB_00a88887;
            }
            uVar6 = uVar6 - 1 & uVar6;
          } while (uVar6 != 0);
        }
        bVar4 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)pred.this,
                           CONCAT44(in_stack_fffffffffffffbbc,uVar12));
        if (bVar4) {
          memset(&local_1d8,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_unsigned_int>
          ::table_locator(&local_1d8);
          goto LAB_00a88887;
        }
        bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_158,*(size_t *)(in_RDI + 0xb8));
      } while (bVar4);
      memset(&local_1d8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_unsigned_int>
      ::table_locator(&local_1d8);
LAB_00a88887:
      local_1b0 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::make_iterator((locator *)0xa88898);
      local_1f8 = (table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_1b0.pc_;
      local_1f0 = local_1b0.p_;
      local_2d0 = (table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_1b0.pc_;
      local_2c8 = local_1b0.p_;
      this_02 = (table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_1b0.pc_;
      local_2e0 = boost::unordered::
                  unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::end((unordered_flat_set<unsigned_int,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)0xa88936);
      uVar5 = boost::unordered::detail::foa::operator==
                        ((table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)pred.this,
                         (table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)CONCAT44(in_stack_fffffffffffffbbc,uVar12));
      if ((bool)uVar5) {
        local_1e8 = &local_2bc;
        local_128 = local_1e8;
        local_70 = local_1e8;
        puVar11 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::key_from<unsigned_int>((uint *)0xa889e8);
        local_78 = puVar11;
        local_80 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::hash_for<unsigned_int>
                             ((table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)pred.this,(uint *)CONCAT44(in_stack_fffffffffffffbbc,uVar12));
        local_88 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)pred.this,CONCAT44(in_stack_fffffffffffffbbc,uVar12));
        local_10 = local_78;
        local_20 = local_80;
        local_18 = local_88;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_88);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<unsigned_int,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<unsigned_int>_>
                     ::groups((table_arrays<unsigned_int,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<unsigned_int>_>
                               *)0xa88ac6);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               (this_01,(size_t)pred.this);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<unsigned_int,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<unsigned_int>_>
                       ::elements((table_arrays<unsigned_int,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<unsigned_int>_>
                                   *)0xa88b1b);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffbe0 =
                   (table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::pred((table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)0xa88b6b);
              __x = local_10;
              __y = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::key_from<unsigned_int>((uint *)0xa88b95);
              bVar4 = std::equal_to<unsigned_int>::operator()
                                ((equal_to<unsigned_int> *)in_stack_fffffffffffffbe0,__x,__y);
              if (bVar4) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_unsigned_int>
                ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
                goto LAB_00a88c9c;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          in_stack_fffffffffffffbdf =
               boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                   pred.this,CONCAT44(in_stack_fffffffffffffbbc,uVar12));
          if ((bool)in_stack_fffffffffffffbdf) {
            memset(&local_a0,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_unsigned_int>
            ::table_locator(&local_a0);
            goto LAB_00a88c9c;
          }
          bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,*(size_t *)(in_RDI + 8));
        } while (bVar4);
        memset(&local_a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_unsigned_int>
        ::table_locator(&local_a0);
LAB_00a88c9c:
        bVar4 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_a0);
        if (bVar4) {
          local_b0 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::make_iterator((locator *)0xa88cbc);
          local_b1 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_2f8,&local_b0,&local_b1);
        }
        else if (*(ulong *)(in_RDI + 0x28) < *(ulong *)(in_RDI + 0x20)) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
          ::unchecked_emplace_at<unsigned_int_const&>
                    (in_stack_fffffffffffffbe0,
                     CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                     (size_t)in_stack_fffffffffffffbd0,(uint *)this_01);
          local_c8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::make_iterator((locator *)0xa88d3e);
          local_e1[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_2f8,&local_c8,local_e1);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
          ::unchecked_emplace_with_rehash<unsigned_int_const&>
                    (this_02,CONCAT17(uVar5,in_stack_fffffffffffffc28),puVar11);
          local_f8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::make_iterator((locator *)0xa88da6);
          local_111[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                    (&local_2f8,&local_f8,local_111);
        }
      }
    }
    boost::unordered::
    erase_if<std::pair<unsigned_int,unsigned_int>,slang::hash<std::pair<unsigned_int,unsigned_int>,void>,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<unsigned_int,unsigned_int>>,slang::analysis::CaseDecisionDag::CaseDecisionDag(std::span<slang::SVInt_const,18446744073709551615ul>,unsigned_int,bool,unsigned_int)::__0>
              ((unordered_flat_set<std::pair<unsigned_int,_unsigned_int>,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)CONCAT44(in_stack_fffffffffffffbbc,uVar12),pred);
    local_2ac = 0;
  }
  else {
    *(undefined1 *)(in_RDI + 0x78) = 1;
    local_2ac = 1;
  }
  SVInt::~SVInt((SVInt *)in_stack_fffffffffffffbd0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffbd0);
  return;
}

Assistant:

CaseDecisionDag::CaseDecisionDag(std::span<const SVInt> clauses, uint32_t bitWidth, bool wildcardX,
                                 uint32_t maxSteps) {
    SLANG_ASSERT(bitWidth > 0);

    std::vector<ClauseIndex> activeIndices(clauses.size());
    std::iota(activeIndices.begin(), activeIndices.end(), 0);

#if defined(SLANG_DEBUG)
    for (auto& clause : clauses)
        SLANG_ASSERT(clause.getBitWidth() == bitWidth);
#endif

    SVInt start(bitWidth, 0, false);
    build(0, clauses, bitWidth, wildcardX, maxSteps, start, std::move(activeIndices));

    if (steps >= maxSteps) {
        gaveUp = true;
        return;
    }

    // Any clauses not used are marked as redundant.
    for (size_t i = 0; i < clauses.size(); i++) {
        auto index = (ClauseIndex)i;
        if (usedIndices.find(index) == usedIndices.end())
            unreachableClauses.insert(index);
    }

    // Remove overlapping clauses that are fully unreachable.
    erase_if(overlappingClauses, [&](const auto& pair) {
        return unreachableClauses.contains(pair.first) || unreachableClauses.contains(pair.second);
    });
}